

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

Mat6x6d * __thiscall
OpenMD::HydroProp::getDiffusionTensorAtPos
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,Vector3d *pos,RealType temperature)

{
  undefined8 uVar1;
  uint i;
  long lVar2;
  double *pdVar3;
  undefined8 *puVar4;
  uint i_2;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  undefined8 *puVar9;
  uint j;
  long lVar10;
  uint k;
  long lVar11;
  double dVar12;
  SquareMatrix3<double> result_11;
  Mat3x3d Drr;
  Mat3x3d Dpostr;
  Mat3x3d Dtr;
  RectMatrix<double,_3U,_3U> result_6;
  Mat3x3d Dposrr;
  Mat3x3d Dpostt;
  Mat3x3d Dtt;
  SquareMatrix3<double> result_7;
  SquareMatrix3<double> result_5;
  SquareMatrix3<double> result_1;
  SquareMatrix3<double> result_2;
  RectMatrix<double,_3U,_3U> result_8;
  Mat6x6d D;
  SquareMatrix3<double> result_4;
  RectMatrix<double,_3U,_3U> result_3;
  double local_638;
  double dStack_630;
  double local_628;
  double dStack_620;
  undefined8 local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  undefined8 local_5f8;
  undefined8 local_5e8 [10];
  double local_598 [10];
  undefined8 local_548 [10];
  double local_4f8 [10];
  double local_4a8 [10];
  undefined8 local_458 [10];
  undefined8 local_408 [10];
  undefined8 local_3b8 [10];
  double local_368 [10];
  double local_318 [10];
  double local_2c8 [10];
  double local_278 [10];
  undefined8 local_228 [10];
  Mat6x6d local_1d8;
  double local_b8 [10];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pdVar5 = &local_638;
  pdVar3 = &local_638;
  local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][0] = 0.0;
  local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][1] = 0.0;
  local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][2] = 0.0;
  lVar2 = 0;
  do {
    local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][lVar2] =
         (pos->super_Vector<double,_3U>).data_[lVar2] -
         (this->cor_).super_Vector<double,_3U>.data_[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dStack_630 = -local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][2];
  lVar2 = 0;
  local_5f8 = 0;
  local_638 = 0.0;
  local_628 = local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][1];
  dStack_620 = local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][2];
  local_618 = 0;
  dStack_610 = -local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][0];
  local_608 = -local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][1];
  dStack_600 = local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0][0];
  getDiffusionTensor(&local_1d8,this,temperature);
  local_3b8[8] = 0;
  local_3b8[6] = 0;
  local_3b8[7] = 0;
  local_3b8[4] = 0;
  local_3b8[5] = 0;
  local_3b8[2] = 0;
  local_3b8[3] = 0;
  local_3b8[0] = 0;
  local_3b8[1] = 0;
  local_4f8[8] = 0.0;
  local_4f8[6] = 0.0;
  local_4f8[7] = 0.0;
  local_4f8[4] = 0.0;
  local_4f8[5] = 0.0;
  local_4f8[2] = 0.0;
  local_4f8[3] = 0.0;
  local_4f8[0] = 0.0;
  local_4f8[1] = 0.0;
  local_598[8] = 0.0;
  local_598[6] = 0.0;
  local_598[7] = 0.0;
  local_598[4] = 0.0;
  local_598[5] = 0.0;
  local_598[2] = 0.0;
  local_598[3] = 0.0;
  local_598[0] = 0.0;
  local_598[1] = 0.0;
  do {
    *(undefined8 *)((long)local_3b8 + lVar2 + 0x10) =
         *(undefined8 *)
          ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar2 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar2 * 2 + 8);
    *(undefined8 *)((long)local_3b8 + lVar2) =
         *(undefined8 *)((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar2 * 2);
    *(undefined8 *)((long)local_3b8 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_4f8 + lVar2 + 0x10) =
         *(undefined8 *)
          ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2 + 8);
    *(undefined8 *)((long)local_4f8 + lVar2) =
         *(undefined8 *)((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2);
    *(undefined8 *)((long)local_4f8 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_598 + lVar2 + 0x10) =
         *(undefined8 *)
          ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2 + 0x28);
    uVar1 = *(undefined8 *)
             ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2 + 0x20);
    *(undefined8 *)((long)local_598 + lVar2) =
         *(undefined8 *)
          ((long)local_1d8.super_RectMatrix<double,_6U,_6U>.data_[3] + lVar2 * 2 + 0x18);
    *(undefined8 *)((long)local_598 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  local_408[6] = 0;
  local_408[7] = 0;
  local_408[4] = 0;
  local_408[5] = 0;
  local_408[2] = 0;
  local_408[3] = 0;
  local_408[0] = 0;
  local_408[1] = 0;
  lVar2 = 0;
  local_408[8] = 0;
  local_548[8] = 0;
  local_548[6] = 0;
  local_548[7] = 0;
  local_548[4] = 0;
  local_548[5] = 0;
  local_548[2] = 0;
  local_548[3] = 0;
  local_548[0] = 0;
  local_548[1] = 0;
  local_458[8] = 0;
  local_458[6] = 0;
  local_458[7] = 0;
  local_458[4] = 0;
  local_458[5] = 0;
  local_458[2] = 0;
  local_458[3] = 0;
  local_458[0] = 0;
  local_458[1] = 0;
  local_2c8[8] = 0.0;
  local_2c8[6] = 0.0;
  local_2c8[7] = 0.0;
  local_2c8[4] = 0.0;
  local_2c8[5] = 0.0;
  local_2c8[2] = 0.0;
  local_2c8[3] = 0.0;
  local_2c8[0] = 0.0;
  local_2c8[1] = 0.0;
  do {
    lVar10 = 0;
    pdVar6 = local_598;
    do {
      dVar12 = local_2c8[lVar2 * 3 + lVar10];
      lVar11 = 0;
      pdVar8 = pdVar6;
      do {
        dVar12 = dVar12 + *(double *)((long)pdVar5 + lVar11 * 8) * *pdVar8;
        lVar11 = lVar11 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar11 != 3);
      local_2c8[lVar2 * 3 + lVar10] = dVar12;
      lVar10 = lVar10 + 1;
      pdVar6 = pdVar6 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar5 = (double *)((long)pdVar5 + 0x18);
  } while (lVar2 != 3);
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[8] = 0.0;
  pdVar5 = local_2c8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    pdVar6 = &local_638;
    do {
      dVar12 = local_278[lVar2 * 3 + lVar10];
      lVar11 = 0;
      pdVar8 = pdVar6;
      do {
        dVar12 = dVar12 + pdVar5[lVar11] * *pdVar8;
        lVar11 = lVar11 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar11 != 3);
      local_278[lVar2 * 3 + lVar10] = dVar12;
      lVar10 = lVar10 + 1;
      pdVar6 = pdVar6 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar2 != 3);
  puVar4 = &local_68;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_28 = 0;
  pdVar5 = local_278;
  puVar7 = local_3b8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      puVar4[lVar10] = (double)puVar7[lVar10] - pdVar5[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 3;
    pdVar5 = pdVar5 + 3;
    puVar7 = puVar7 + 3;
  } while (lVar2 != 3);
  pdVar5 = local_b8;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  pdVar6 = local_4f8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    pdVar8 = pdVar5;
    do {
      *pdVar8 = pdVar6[lVar10];
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar5 = pdVar5 + 1;
    pdVar6 = pdVar6 + 3;
  } while (lVar2 != 3);
  local_318[6] = 0.0;
  local_318[7] = 0.0;
  local_318[4] = 0.0;
  local_318[5] = 0.0;
  local_318[2] = 0.0;
  local_318[3] = 0.0;
  local_318[0] = 0.0;
  local_318[1] = 0.0;
  local_318[8] = 0.0;
  pdVar5 = local_b8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    pdVar6 = &local_638;
    do {
      dVar12 = local_318[lVar2 * 3 + lVar10];
      lVar11 = 0;
      pdVar8 = pdVar6;
      do {
        dVar12 = dVar12 + pdVar5[lVar11] * *pdVar8;
        lVar11 = lVar11 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar11 != 3);
      local_318[lVar2 * 3 + lVar10] = dVar12;
      lVar10 = lVar10 + 1;
      pdVar6 = pdVar6 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar2 != 3);
  pdVar5 = local_4a8;
  local_4a8[6] = 0.0;
  local_4a8[7] = 0.0;
  local_4a8[4] = 0.0;
  local_4a8[5] = 0.0;
  local_4a8[2] = 0.0;
  local_4a8[3] = 0.0;
  local_4a8[0] = 0.0;
  local_4a8[1] = 0.0;
  local_4a8[8] = 0.0;
  pdVar6 = local_318;
  puVar4 = &local_68;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      pdVar5[lVar10] = (double)puVar4[lVar10] + pdVar6[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar5 = pdVar5 + 3;
    pdVar6 = pdVar6 + 3;
    puVar4 = puVar4 + 3;
  } while (lVar2 != 3);
  local_368[6] = 0.0;
  local_368[7] = 0.0;
  local_368[4] = 0.0;
  local_368[5] = 0.0;
  local_368[2] = 0.0;
  local_368[3] = 0.0;
  local_368[0] = 0.0;
  local_368[1] = 0.0;
  local_368[8] = 0.0;
  lVar2 = 0;
  do {
    lVar10 = 0;
    pdVar5 = local_4f8;
    do {
      dVar12 = local_368[lVar2 * 3 + lVar10];
      lVar11 = 0;
      pdVar6 = pdVar5;
      do {
        dVar12 = dVar12 + *(double *)((long)pdVar3 + lVar11 * 8) * *pdVar6;
        lVar11 = lVar11 + 1;
        pdVar6 = pdVar6 + 3;
      } while (lVar11 != 3);
      local_368[lVar2 * 3 + lVar10] = dVar12;
      lVar10 = lVar10 + 1;
      pdVar5 = pdVar5 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar3 = (double *)((long)pdVar3 + 0x18);
  } while (lVar2 != 3);
  puVar4 = local_228;
  local_228[6] = 0;
  local_228[7] = 0;
  local_228[4] = 0;
  local_228[5] = 0;
  local_228[2] = 0;
  local_228[3] = 0;
  local_228[0] = 0;
  local_228[1] = 0;
  local_228[8] = 0;
  pdVar3 = local_368;
  pdVar5 = local_4a8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      puVar4[lVar10] = pdVar5[lVar10] - pdVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 3;
    pdVar3 = pdVar3 + 3;
    pdVar5 = pdVar5 + 3;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_5e8 + lVar2 + 0x10) =
         *(undefined8 *)((long)local_228 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_228 + lVar2 + 8);
    *(undefined8 *)((long)local_5e8 + lVar2) = *(undefined8 *)((long)local_228 + lVar2);
    *(undefined8 *)((long)local_5e8 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_408 + lVar2 + 0x10) =
         *(undefined8 *)((long)local_5e8 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_5e8 + lVar2 + 8);
    *(undefined8 *)((long)local_408 + lVar2) = *(undefined8 *)((long)local_5e8 + lVar2);
    *(undefined8 *)((long)local_408 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_458 + lVar2 + 0x10) =
         *(undefined8 *)((long)local_598 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_598 + lVar2 + 8);
    *(undefined8 *)((long)local_458 + lVar2) = *(undefined8 *)((long)local_598 + lVar2);
    *(undefined8 *)((long)local_458 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  local_4a8[6] = 0.0;
  local_4a8[7] = 0.0;
  local_4a8[4] = 0.0;
  local_4a8[5] = 0.0;
  local_4a8[2] = 0.0;
  local_4a8[3] = 0.0;
  local_4a8[0] = 0.0;
  local_4a8[1] = 0.0;
  local_4a8[8] = 0.0;
  pdVar3 = local_598;
  lVar2 = 0;
  do {
    lVar10 = 0;
    pdVar5 = &local_638;
    do {
      dVar12 = local_4a8[lVar2 * 3 + lVar10];
      lVar11 = 0;
      pdVar6 = pdVar5;
      do {
        dVar12 = dVar12 + pdVar3[lVar11] * *pdVar6;
        lVar11 = lVar11 + 1;
        pdVar6 = pdVar6 + 3;
      } while (lVar11 != 3);
      local_4a8[lVar2 * 3 + lVar10] = dVar12;
      lVar10 = lVar10 + 1;
      pdVar5 = pdVar5 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar2 != 3);
  puVar4 = local_228;
  local_228[6] = 0;
  local_228[7] = 0;
  local_228[4] = 0;
  local_228[5] = 0;
  local_228[2] = 0;
  local_228[3] = 0;
  local_228[0] = 0;
  local_228[1] = 0;
  local_228[8] = 0;
  pdVar3 = local_4a8;
  pdVar5 = local_4f8;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      puVar4[lVar10] = pdVar5[lVar10] + pdVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 3;
    pdVar3 = pdVar3 + 3;
    pdVar5 = pdVar5 + 3;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_5e8 + lVar2 + 0x10) =
         *(undefined8 *)((long)local_228 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_228 + lVar2 + 8);
    *(undefined8 *)((long)local_5e8 + lVar2) = *(undefined8 *)((long)local_228 + lVar2);
    *(undefined8 *)((long)local_5e8 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_548 + lVar2 + 0x10) =
         *(undefined8 *)((long)local_5e8 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_5e8 + lVar2 + 8);
    *(undefined8 *)((long)local_548 + lVar2) = *(undefined8 *)((long)local_5e8 + lVar2);
    *(undefined8 *)((long)local_548 + lVar2 + 8) = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  memset(__return_storage_ptr__,0,0x120);
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar2 * 2 + 0x10)
         = *(undefined8 *)((long)local_408 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_408 + lVar2 + 8);
    puVar4 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar2 * 2)
    ;
    *puVar4 = *(undefined8 *)((long)local_408 + lVar2);
    puVar4[1] = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  puVar4 = local_5e8;
  local_5e8[6] = 0;
  local_5e8[7] = 0;
  local_5e8[4] = 0;
  local_5e8[5] = 0;
  local_5e8[2] = 0;
  local_5e8[3] = 0;
  local_5e8[0] = 0;
  local_5e8[1] = 0;
  local_5e8[8] = 0;
  puVar7 = local_548;
  lVar2 = 0;
  do {
    lVar10 = 0;
    puVar9 = puVar4;
    do {
      *puVar9 = puVar7[lVar10];
      lVar10 = lVar10 + 1;
      puVar9 = puVar9 + 3;
    } while (lVar10 != 3);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 1;
    puVar7 = puVar7 + 3;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar2 * 2 + 0x28)
         = *(undefined8 *)((long)local_5e8 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_5e8 + lVar2 + 8);
    puVar4 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] +
             lVar2 * 2 + 0x18);
    *puVar4 = *(undefined8 *)((long)local_5e8 + lVar2);
    puVar4[1] = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar2 * 2 + 0x10)
         = *(undefined8 *)((long)local_548 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_548 + lVar2 + 8);
    puVar4 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar2 * 2)
    ;
    *puVar4 = *(undefined8 *)((long)local_548 + lVar2);
    puVar4[1] = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar2 * 2 + 0x28)
         = *(undefined8 *)((long)local_458 + lVar2 + 0x10);
    uVar1 = *(undefined8 *)((long)local_458 + lVar2 + 8);
    puVar4 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] +
             lVar2 * 2 + 0x18);
    *puVar4 = *(undefined8 *)((long)local_458 + lVar2);
    puVar4[1] = uVar1;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getDiffusionTensorAtPos(Vector3d pos,
                                             RealType temperature) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_

    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat6x6d D = getDiffusionTensor(temperature);

    Mat3x3d Dtt;
    Mat3x3d Dtr;
    Mat3x3d Drr;

    D.getSubMatrix(0, 0, Dtt);
    D.getSubMatrix(3, 0, Dtr);
    D.getSubMatrix(3, 3, Drr);

    // calculate Diffusion Tensor at new location
    Mat3x3d Dpostt;  // translational diffusion tensor at new location
    Mat3x3d Dpostr;  // rotational diffusion tensor at new location
    Mat3x3d Dposrr;  // translation-rotation coupling diffusion tensor
                     // at new location

    Dpostt = Dtt - U * Drr * U + Dtr.transpose() * U - U * Dtr;
    Dposrr = Drr;
    Dpostr = Dtr + Drr * U;

    Mat6x6d Dpos;
    Dpos.setSubMatrix(0, 0, Dpostt);
    Dpos.setSubMatrix(0, 3, Dpostr.transpose());
    Dpos.setSubMatrix(3, 0, Dpostr);
    Dpos.setSubMatrix(3, 3, Dposrr);
    return Dpos;
  }